

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# write_tables.c
# Opt level: O3

void start_array_fn(File *fp,int type_size,char *type_prefix,char *type_str,char *name,
                   char *length_str,int length_data,char *whitespace)

{
  new_offset(fp,name);
  if (fp->binary == 0) {
    if (length_data == 0) {
      myfprintf(fp->fp,"%s%s %s[] = {%s",type_prefix,type_str,name,whitespace);
      return;
    }
    if (*length_str == '\0') {
      myfprintf(fp->fp,"%s%s %s[%d] = {%s",type_prefix,type_str,name,(ulong)(uint)length_data,
                whitespace);
    }
    else {
      myfprintf(fp->fp,"%s%s %s[%s] = {%s",type_prefix,type_str,name,length_str,whitespace);
    }
  }
  else {
    fp->array_length = length_data;
    fp->n_elems = 0;
    fp->elem_size = type_size;
  }
  return;
}

Assistant:

static void start_array_fn(File *fp, int type_size, char *type_prefix, char *type_str, char *name, char *length_str,
                           int length_data, char *whitespace) {
  new_offset(fp, name);
  if (fp->binary) {
    start_array_internal(fp, length_data, type_size);
  } else {
    if (length_data == 0)
      fprintf(fp->fp, "%s%s %s[] = {%s", type_prefix, type_str, name, whitespace);
    else if (strlen(length_str) == 0)
      fprintf(fp->fp, "%s%s %s[%d] = {%s", type_prefix, type_str, name, length_data, whitespace);
    else
      fprintf(fp->fp, "%s%s %s[%s] = {%s", type_prefix, type_str, name, length_str, whitespace);
  }
}